

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPPacketBuilder::RTCPPacketBuilder
          (RTCPPacketBuilder *this,RTPSources *s,RTPPacketBuilder *pb,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  RTPPacketBuilder *pb_local;
  RTPSources *s_local;
  RTCPPacketBuilder *this_local;
  
  RTPMemoryObject::RTPMemoryObject(&this->super_RTPMemoryObject,mgr);
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPPacketBuilder_00192900;
  this->sources = s;
  this->rtppacketbuilder = pb;
  RTPTime::RTPTime(&this->prevbuildtime,0,0);
  RTPTime::RTPTime(&this->transmissiondelay,0,0);
  RTCPSDESInfoInternal::RTCPSDESInfoInternal(&this->ownsdesinfo,mgr);
  this->init = false;
  RTPTimeInitializerObject::Dummy((RTPTimeInitializerObject *)&timeinit);
  return;
}

Assistant:

RTCPPacketBuilder::RTCPPacketBuilder(RTPSources &s,RTPPacketBuilder &pb,RTPMemoryManager *mgr)
	: RTPMemoryObject(mgr),sources(s),rtppacketbuilder(pb),prevbuildtime(0,0),transmissiondelay(0,0),ownsdesinfo(mgr)
{
	init = false;
	timeinit.Dummy();
}